

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

char * Gia_ManToMiniLutAttr(Gia_Man_t *pGia,void *pMiniLut)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int Id;
  
  pcVar2 = (char *)calloc((long)*(int *)((long)pMiniLut + 4),1);
  for (Id = 1; Id < pGia->nObjs; Id = Id + 1) {
    iVar1 = Gia_ObjIsLut(pGia,Id);
    if (iVar1 != 0) {
      piVar3 = Gia_ObjLutFanins(pGia,Id);
      iVar1 = Gia_ObjLutSize(pGia,Id);
      if (piVar3[iVar1] < 0) {
        pGVar4 = Gia_ManObj(pGia,Id);
        pcVar2[pGVar4->Value] = '\x01';
      }
    }
  }
  return pcVar2;
}

Assistant:

char * Gia_ManToMiniLutAttr( Gia_Man_t * pGia, void * pMiniLut )
{ 
    Mini_Lut_t * p = (Mini_Lut_t *)pMiniLut; int i;
    char * pAttrs = ABC_CALLOC( char, Mini_LutNodeNum(p) );
    Gia_ManForEachLut( pGia, i )
        if ( Gia_ObjLutIsMux(pGia, i) )
            pAttrs[Gia_ManObj(pGia, i)->Value] = 1;
    return pAttrs;
}